

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketHelper.cpp
# Opt level: O0

int hwnet::SetNoBlock(int fd,bool nonBlock)

{
  undefined4 local_18;
  int flags;
  int iStack_c;
  bool nonBlock_local;
  int fd_local;
  
  local_18 = fcntl(fd,3,0);
  if (local_18 == 0xffffffff) {
    iStack_c = -1;
  }
  else {
    if (nonBlock) {
      local_18 = local_18 | 0x800;
    }
    else {
      local_18 = local_18 ^ 0x800;
    }
    iStack_c = fcntl(fd,4,(ulong)local_18);
  }
  return iStack_c;
}

Assistant:

int SetNoBlock(int fd,bool nonBlock) {
	int flags;
    if((flags = fcntl(fd, F_GETFL, 0)) == -1) {
    	return -1;
    }

    if(nonBlock){
    	flags |= O_NONBLOCK;
    } else {
    	flags ^= O_NONBLOCK;
    }

    return fcntl(fd, F_SETFL, flags);
}